

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::vector3d>
          (GeomPrimvar *this,vector3d *dest,string *err)

{
  Attribute *this_00;
  void *pvVar1;
  vtable_type *pvVar2;
  pointer pSVar3;
  uint32_t uVar4;
  vector3d *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar6;
  bool bVar7;
  undefined7 local_b8;
  undefined4 uStack_b1;
  undefined4 uStack_ad;
  undefined4 uStack_a9;
  undefined4 uStack_a5;
  undefined1 uStack_a1;
  undefined7 uStack_a0;
  bool local_98 [8];
  undefined1 local_90 [28];
  undefined1 local_74 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined4 local_49;
  undefined4 uStack_45;
  undefined4 uStack_41;
  undefined4 uStack_3d;
  double local_39;
  
  if (dest == (vector3d *)0x0) {
joined_r0x001cb43a:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar2 = (this->_attr)._var._value.v_.vtable;
      if (pvVar2 == (vtable_type *)0x0) {
        bVar6 = false;
      }
      else {
        uVar4 = (*pvVar2->type_id)();
        bVar6 = uVar4 == 4;
      }
      if ((bVar6) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001cb43a;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar2 = (this->_attr)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar4 = (*pvVar2->type_id)(), uVar4 == 0)) ||
        ((pvVar2 = (this->_attr)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar4 = (*pvVar2->type_id)(), uVar4 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar7 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar6 = !bVar7;
        if (bVar7) {
          if (err == (string *)0x0) {
            return bVar6;
          }
          std::__cxx11::string::append((char *)err);
          return bVar6;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar3 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar3) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pvVar5 = tinyusdz::value::Value::as<tinyusdz::value::vector3d>(&pSVar3->value,false);
        if (pvVar5 != (vector3d *)0x0) {
          dest->z = pvVar5->z;
          local_49 = *(undefined4 *)&pvVar5->x;
          uStack_45 = *(undefined4 *)((long)&pvVar5->x + 4);
          uStack_41 = *(undefined4 *)&pvVar5->y;
          uStack_3d = *(undefined4 *)((long)&pvVar5->y + 4);
          local_98[0] = bVar6;
          goto LAB_001cb57f;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar4 = Attribute::type_id(this_00);
      bVar6 = IsSupportedGeomPrimvarType(uVar4);
      if (bVar6) {
        primvar::PrimVar::get_value<tinyusdz::value::vector3d>
                  ((optional<tinyusdz::value::vector3d> *)local_98,&(this->_attr)._var);
        if (local_98[0] == true) {
          uStack_a1 = (undefined1)local_90._16_8_;
          uStack_a0 = SUB87(local_90._16_8_,1);
          uStack_b1 = local_90._0_4_;
          uStack_ad = local_90._4_4_;
          uStack_a9 = local_90._8_4_;
          uStack_a5 = local_90._12_4_;
          local_49 = local_90._0_4_;
          uStack_45 = local_90._4_4_;
          uStack_41 = local_90._8_4_;
          uStack_3d = local_90._12_4_;
          local_39 = (double)local_90._16_8_;
        }
        if (local_98[0] == false) {
          if (err == (string *)0x0) {
            return false;
          }
          local_b8 = (undefined7)((long)&uStack_a9 + 1);
          uStack_b1._0_1_ = (undefined1)((ulong)((long)&uStack_a9 + 1) >> 0x38);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_74._0_4_ = 0x47;
          Attribute::type_name_abi_cxx11_((string *)(local_74 + 4),this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)local_98,(fmt *)&local_b8,(string *)local_74,(uint *)(local_74 + 4),
                     in_R8);
          std::__cxx11::string::_M_append((char *)err,CONCAT71(local_98._1_7_,local_98[0]));
          if ((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]) != local_90 + 8) {
            operator_delete((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]),
                            CONCAT44(local_90._12_4_,local_90._8_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_74._4_8_ != &local_60) {
            operator_delete((void *)local_74._4_8_,local_60._M_allocated_capacity + 1);
          }
          if ((void *)CONCAT17((undefined1)uStack_b1,local_b8) == (void *)((long)&uStack_a9 + 1)) {
            return false;
          }
          operator_delete((void *)CONCAT17((undefined1)uStack_b1,local_b8),
                          CONCAT17(uStack_a1,CONCAT43(uStack_a5,uStack_a9._1_3_)) + 1);
          return false;
        }
        dest->z = local_39;
LAB_001cb57f:
        *(undefined4 *)&dest->x = local_49;
        *(undefined4 *)((long)&dest->x + 4) = uStack_45;
        *(undefined4 *)&dest->y = uStack_41;
        *(undefined4 *)((long)&dest->y + 4) = uStack_3d;
        return local_98[0];
      }
      if (err != (string *)0x0) {
        pvVar1 = (void *)((long)&uStack_a9 + 1);
        local_b8 = SUB87(pvVar1,0);
        uStack_b1._0_1_ = (undefined1)((ulong)pvVar1 >> 0x38);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_74 + 4),this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_98,(fmt *)&local_b8,(string *)(local_74 + 4),in_RCX);
        std::__cxx11::string::_M_append((char *)err,CONCAT71(local_98._1_7_,local_98[0]));
        if ((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]) != local_90 + 8) {
          operator_delete((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]),
                          CONCAT44(local_90._12_4_,local_90._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_74._4_8_ != &local_60) {
          operator_delete((void *)local_74._4_8_,local_60._M_allocated_capacity + 1);
        }
        if ((void *)CONCAT17((undefined1)uStack_b1,local_b8) != pvVar1) {
          operator_delete((void *)CONCAT17((undefined1)uStack_b1,local_b8),
                          CONCAT17(uStack_a1,CONCAT43(uStack_a5,uStack_a9._1_3_)) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}